

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevent_fork.h
# Opt level: O2

void __thiscall snmalloc::PreventFork::PreventFork(PreventFork *this)

{
  long lVar1;
  Atomic<size_t> AVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + -0x18);
  *(long *)(in_FS_OFFSET + -0x18) = lVar1 + 1;
  if (lVar1 == 0) {
    ensure_init();
    AVar2 = threads_preventing_fork;
    while( true ) {
      LOCK();
      threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)
           (__atomic_base<unsigned_long>)(AVar2.super___atomic_base<unsigned_long>._M_i + 2)._M_i;
      UNLOCK();
      if (((ulong)AVar2.super___atomic_base<unsigned_long>._M_i & 1) == 0) break;
      LOCK();
      UNLOCK();
      do {
      } while (((ulong)AVar2.super___atomic_base<unsigned_long>._M_i & 1) != 0);
    }
    return;
  }
  return;
}

Assistant:

PreventFork()
    {
      if (depth_of_prevention++ == 0)
      {
        // Ensure that the system is initialised before we start.
        // Don't do this on nested Prevent calls.
        ensure_init();
        while (true)
        {
          auto prev = threads_preventing_fork.fetch_add(2);
          if (prev % 2 == 0)
            break;

          threads_preventing_fork.fetch_sub(2);

          while ((threads_preventing_fork.load() % 2) == 1)
          {
            Aal::pause();
          }
        };
      }
    }